

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
::destroy(AdapterPromiseNode<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>_>
          *this)

{
  WeakFulfiller<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_> *this_00
  ;
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  
  this_00 = (this->adapter).wrapper;
  if ((this_00->super_WeakFulfillerBase).inner == (PromiseRejector *)0x0) {
    AsyncObject::~AsyncObject((AsyncObject *)this_00);
    operator_delete(this_00,0x18);
  }
  else {
    (this_00->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  }
  if ((((this->result).value.ptr.isSet == true) &&
      ((this->result).value.ptr.field_1.value.ptr.isSet == true)) &&
     (lVar1 = *(long *)((long)&(this->result).value.ptr.field_1 + 8), lVar1 != 0)) {
    uVar2 = *(undefined8 *)((long)&(this->result).value.ptr.field_1 + 0x10);
    *(undefined8 *)((long)&(this->result).value.ptr.field_1 + 8) = 0;
    *(undefined8 *)((long)&(this->result).value.ptr.field_1 + 0x10) = 0;
    puVar3 = *(undefined8 **)((long)&(this->result).value.ptr.field_1 + 0x18);
    (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  AsyncObject::~AsyncObject
            ((AsyncObject *)
             &this->
              super_PromiseFulfiller<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
            );
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }